

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldTest_MergeFromMessageWithArena_Test::
RepeatedPtrFieldTest_MergeFromMessageWithArena_Test
          (RepeatedPtrFieldTest_MergeFromMessageWithArena_Test *this)

{
  RepeatedPtrFieldTest_MergeFromMessageWithArena_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__RepeatedPtrFieldTest_MergeFromMessageWithArena_Test_029ea3e8;
  return;
}

Assistant:

TEST(RepeatedPtrFieldTest, MergeFromMessageWithArena) {
  using Field = RepeatedPtrField<TestAllTypes::NestedMessage>;
  Arena arena;
  Field* source = Arena::Create<Field>(&arena);
  Field* destination = Arena::Create<Field>(&arena);
  source->Add()->set_bb(4);
  source->Add()->set_bb(5);
  destination->Add()->set_bb(1);
  destination->Add()->set_bb(2);
  destination->Add()->set_bb(3);

  destination->MergeFrom(*source);

  ASSERT_EQ(5, destination->size());
  EXPECT_EQ(1, destination->Get(0).bb());
  EXPECT_EQ(2, destination->Get(1).bb());
  EXPECT_EQ(3, destination->Get(2).bb());
  EXPECT_EQ(4, destination->Get(3).bb());
  EXPECT_EQ(5, destination->Get(4).bb());
}